

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaVStart(xmlSchemaValidCtxtPtr vctxt)

{
  xmlElementType nodeType;
  int iVar1;
  int iVar2;
  xmlNodePtr pxVar3;
  int *piVar4;
  char *message;
  xmlChar *nsName;
  char *funcName;
  int *in_R9;
  xmlNodePtr pxVar5;
  xmlSchemaNodeInfoPtr pxVar6;
  _xmlNode *p_Var7;
  xmlChar *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  
  iVar1 = xmlSchemaPreRun(vctxt);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    if (vctxt->doc == (xmlDoc *)0x0) {
      iVar1 = 0;
      if (vctxt->reader == (xmlTextReaderPtr)0x0) {
        if ((vctxt->sax == (xmlSAXHandlerPtr)0x0) || (vctxt->parserCtxt == (xmlParserCtxtPtr)0x0)) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVStart","no instance to validate");
LAB_001883f7:
          iVar1 = -1;
        }
        else {
          iVar1 = xmlParseDocument(vctxt->parserCtxt);
        }
      }
    }
    else {
      pxVar3 = vctxt->validationRoot;
      if ((pxVar3 == (xmlNodePtr)0x0) &&
         (pxVar3 = xmlDocGetRootElement(vctxt->doc), pxVar3 == (xmlNodePtr)0x0)) {
        iVar1 = 1;
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_ERR_INTERNAL_ERROR,(xmlNodePtr)0x0,
                           (xmlSchemaBasicItemPtr)0x0,"The document has no document element",
                           (xmlChar *)0x0,(xmlChar *)0x0);
      }
      else {
        vctxt->depth = -1;
        vctxt->validationRoot = pxVar3;
        pxVar6 = (xmlSchemaNodeInfoPtr)0x0;
        pxVar5 = pxVar3;
LAB_001881c4:
        p_Var7 = pxVar5;
        iVar1 = -1;
        if ((vctxt->skipDepth != -1) && (vctxt->skipDepth <= vctxt->depth)) goto LAB_00188354;
        nodeType = p_Var7->type;
        if (1 < nodeType - XML_TEXT_NODE) {
          if (nodeType == XML_ELEMENT_NODE) {
            vctxt->depth = vctxt->depth + 1;
            iVar2 = xmlSchemaValidatorPushElem(vctxt);
            if (iVar2 == -1) goto LAB_00188442;
            pxVar6 = vctxt->inode;
            pxVar6->node = p_Var7;
            pxVar6->nodeLine = (uint)p_Var7->line;
            pxVar6->localName = p_Var7->name;
            if (p_Var7->ns != (xmlNs *)0x0) {
              pxVar6->nsName = p_Var7->ns->href;
            }
            *(byte *)&pxVar6->flags = (byte)pxVar6->flags | 0x20;
            vctxt->nbAttrInfos = 0;
            for (pxVar5 = (xmlNodePtr)p_Var7->properties; pxVar5 != (xmlNodePtr)0x0;
                pxVar5 = pxVar5->next) {
              if (pxVar5->ns == (xmlNs *)0x0) {
                nsName = (xmlChar *)0x0;
              }
              else {
                nsName = pxVar5->ns->href;
              }
              piVar4 = (int *)xmlNodeListGetString(pxVar5->doc,pxVar5->children,1);
              in_R9 = piVar4;
              iVar1 = xmlSchemaValidatorPushAttribute
                                (vctxt,pxVar5,pxVar6->nodeLine,pxVar5->name,nsName,(int)piVar4,
                                 in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
              if (iVar1 == -1) {
                xmlSchemaInternalErr
                          ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaDocWalk",
                           "calling xmlSchemaValidatorPushAttribute()");
                (*xmlFree)(piVar4);
                goto LAB_001883f7;
              }
            }
            iVar1 = xmlSchemaValidateElem(vctxt);
            if (iVar1 != 0) {
              if (iVar1 != -1) goto LAB_00188327;
              funcName = "xmlSchemaDocWalk";
              message = "calling xmlSchemaValidateElem()";
              goto LAB_0018843a;
            }
            if ((vctxt->skipDepth == -1) || (vctxt->depth < vctxt->skipDepth)) goto LAB_0018822e;
          }
          else if (nodeType - XML_ENTITY_REF_NODE < 2) {
            funcName = "xmlSchemaVDocWalk";
            message = 
            "there is at least one entity reference in the node-tree currently being validated. Processing of entities with this XML Schema processor is not supported (yet). Please substitute entities before validation."
            ;
            goto LAB_0018843a;
          }
          goto LAB_00188327;
        }
        if ((pxVar6 != (xmlSchemaNodeInfoPtr)0x0) && ((pxVar6->flags & 0x20U) != 0)) {
          pxVar6->flags = pxVar6->flags & 0xffffffdf;
        }
        iVar1 = xmlSchemaVPushText(vctxt,nodeType,p_Var7->content,-1,1,in_R9);
        if (-1 < iVar1) goto LAB_0018822e;
        funcName = "xmlSchemaVDocWalk";
        message = "calling xmlSchemaVPushText()";
LAB_0018843a:
        iVar1 = -1;
        xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)vctxt,funcName,message);
      }
    }
LAB_00188442:
    xmlSchemaPostRun(vctxt);
    if (iVar1 == 0) {
      iVar1 = vctxt->err;
    }
  }
  return iVar1;
LAB_0018822e:
  pxVar5 = p_Var7->children;
  if (p_Var7->children != (_xmlNode *)0x0) goto LAB_001881c4;
LAB_00188327:
  while( true ) {
    if (p_Var7->type == XML_ELEMENT_NODE) {
      if (p_Var7 != vctxt->inode->node) {
        funcName = "xmlSchemaVDocWalk";
        message = "element position mismatch";
        goto LAB_0018843a;
      }
      iVar1 = xmlSchemaValidatorPopElem(vctxt);
      if (iVar1 < 0) {
        funcName = "xmlSchemaVDocWalk";
        message = "calling xmlSchemaValidatorPopElem()";
        goto LAB_0018843a;
      }
      if (p_Var7 == pxVar3) goto LAB_00188442;
    }
LAB_00188354:
    pxVar5 = p_Var7->next;
    if (p_Var7->next != (_xmlNode *)0x0) break;
    p_Var7 = p_Var7->parent;
  }
  goto LAB_001881c4;
}

Assistant:

static int
xmlSchemaVStart(xmlSchemaValidCtxtPtr vctxt)
{
    int ret = 0;

    if (xmlSchemaPreRun(vctxt) < 0)
        return(-1);

    if (vctxt->doc != NULL) {
	/*
	 * Tree validation.
	 */
	ret = xmlSchemaVDocWalk(vctxt);
#ifdef LIBXML_READER_ENABLED
    } else if (vctxt->reader != NULL) {
	/*
	 * XML Reader validation.
	 */
#ifdef XML_SCHEMA_READER_ENABLED
	ret = xmlSchemaVReaderWalk(vctxt);
#endif
#endif
    } else if ((vctxt->sax != NULL) && (vctxt->parserCtxt != NULL)) {
	/*
	 * SAX validation.
	 */
	ret = xmlParseDocument(vctxt->parserCtxt);
    } else {
	VERROR_INT("xmlSchemaVStart",
	    "no instance to validate");
	ret = -1;
    }

    xmlSchemaPostRun(vctxt);
    if (ret == 0)
	ret = vctxt->err;
    return (ret);
}